

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O3

void Fra_SmlSavePattern1(Fra_Man_t *p,int fInit)

{
  Aig_Man_t *pAVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  memset(p->pPatWords,0xff,(long)p->nPatWords << 2);
  if (fInit != 0) {
    pAVar1 = p->pManAig;
    iVar3 = pAVar1->nObjs[2] - pAVar1->nRegs;
    pVVar2 = pAVar1->vCis;
    if (iVar3 < pVVar2->nSize) {
      iVar5 = 0;
      do {
        if (iVar3 < 0) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        iVar4 = p->nFramesAll * iVar3 + iVar5;
        p->pPatWords[iVar4 >> 5] = p->pPatWords[iVar4 >> 5] ^ 1 << ((byte)iVar4 & 0x1f);
        iVar4 = iVar3 + iVar5;
        iVar5 = iVar5 + 1;
      } while (iVar4 + 1 < pVVar2->nSize);
    }
  }
  return;
}

Assistant:

void Fra_SmlSavePattern1( Fra_Man_t * p, int fInit )
{
    Aig_Obj_t * pObj;
    int i, k, nTruePis;
    memset( p->pPatWords, 0xff, sizeof(unsigned) * p->nPatWords );
    if ( !fInit )
        return;
    // clear the state bits to correspond to all-0 initial state
    nTruePis = Aig_ManCiNum(p->pManAig) - Aig_ManRegNum(p->pManAig);
    k = 0;
    Aig_ManForEachLoSeq( p->pManAig, pObj, i )
        Abc_InfoXorBit( p->pPatWords, nTruePis * p->nFramesAll + k++ );
}